

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall
cert::Camera::Camera(Camera *this,Vec3 lookfrom,Vec3 lookat,Vec3 vup,float vfov,float aspect)

{
  float *this_00;
  float *this_01;
  double dVar1;
  Vec3 VVar2;
  undefined8 local_230;
  float local_228;
  undefined8 local_210;
  float local_208;
  undefined8 local_1f0;
  float local_1e8;
  Vec3 local_1e0;
  Vec3 local_1d0;
  Vec3 local_1c0;
  Vec3 local_1b0;
  Vec3 local_1a0;
  Vec3 local_190;
  Vec3 local_180;
  Vec3 local_170;
  undefined8 local_160;
  float local_158;
  Vec3 local_150;
  undefined8 local_140;
  float local_138;
  Vec3 local_130;
  Vec3 local_120;
  Vec3 local_110;
  undefined8 local_100;
  float local_f8;
  Vec3 local_f0;
  Vec3 local_e0;
  Vec3 local_d0;
  Vec3 local_c0;
  float local_b4;
  float local_b0;
  float half_width;
  float half_height;
  float theta;
  Vec3 w;
  undefined4 uStack_94;
  Vec3 v;
  undefined4 uStack_84;
  Vec3 u;
  float aspect_local;
  float vfov_local;
  Camera *this_local;
  undefined1 local_58 [8];
  Vec3 vup_local;
  undefined1 local_38 [8];
  Vec3 lookat_local;
  undefined1 local_18 [8];
  Vec3 lookfrom_local;
  
  vup_local.x = vup.z;
  local_58 = vup._0_8_;
  lookat_local.x = lookat.z;
  register0x00001280 = lookat._0_8_;
  lookfrom_local.x = lookfrom.z;
  register0x00001200 = lookfrom._0_8_;
  local_38 = (undefined1  [8])register0x00001280;
  local_18 = (undefined1  [8])register0x00001200;
  Vec3::Vec3(&this->origin);
  Vec3::Vec3(&this->upper_left_corner);
  Vec3::Vec3(&this->horizontal);
  Vec3::Vec3(&this->vertical);
  this_00 = &v.z;
  Vec3::Vec3((Vec3 *)this_00);
  this_01 = &w.z;
  Vec3::Vec3((Vec3 *)this_01);
  Vec3::Vec3((Vec3 *)&half_height);
  half_width = (vfov * 3.141) / 180.0;
  dVar1 = tan((double)(ulong)(uint)(half_width * 0.5));
  local_b0 = SUB84(dVar1,0);
  local_b4 = aspect * local_b0;
  (this->origin).z = lookfrom_local.x;
  (this->origin).x = (float)local_18._0_4_;
  (this->origin).y = (float)local_18._4_4_;
  VVar2 = operator-((Vec3 *)local_18,(Vec3 *)local_38);
  local_e0.z = VVar2.z;
  local_d0.z = local_e0.z;
  local_e0._0_8_ = VVar2._0_8_;
  local_d0.x = local_e0.x;
  local_d0.y = local_e0.y;
  local_e0 = VVar2;
  VVar2 = normalize(&local_d0);
  local_f0.z = VVar2.z;
  local_c0.z = local_f0.z;
  local_f0._0_8_ = VVar2._0_8_;
  local_c0.x = local_f0.x;
  local_c0.y = local_f0.y;
  w.x = local_f0.z;
  half_height = local_f0.x;
  theta = local_f0.y;
  local_f0 = VVar2;
  VVar2 = cross((Vec3 *)local_58,(Vec3 *)&half_height);
  local_120.z = VVar2.z;
  local_110.z = local_120.z;
  local_120._0_8_ = VVar2._0_8_;
  local_110.x = local_120.x;
  local_110.y = local_120.y;
  local_120 = VVar2;
  VVar2 = normalize(&local_110);
  local_130.z = VVar2.z;
  local_f8 = local_130.z;
  local_130._0_8_ = VVar2._0_8_;
  local_100._0_4_ = local_130.x;
  local_100._4_4_ = local_130.y;
  v.z = local_130.x;
  uStack_84 = local_130.y;
  local_130 = VVar2;
  VVar2 = cross((Vec3 *)&half_height,(Vec3 *)this_00);
  local_150.z = VVar2.z;
  local_138 = local_150.z;
  local_150._0_8_ = VVar2._0_8_;
  local_140._0_4_ = local_150.x;
  local_140._4_4_ = local_150.y;
  v.x = local_150.z;
  w.z = local_150.x;
  uStack_94 = local_150.y;
  local_150 = VVar2;
  VVar2 = operator*(local_b4,(Vec3 *)this_00);
  local_1a0.z = VVar2.z;
  local_190.z = local_1a0.z;
  local_1a0._0_8_ = VVar2._0_8_;
  local_190.x = local_1a0.x;
  local_190.y = local_1a0.y;
  local_1a0 = VVar2;
  VVar2 = operator-(&this->origin,&local_190);
  local_1b0.z = VVar2.z;
  local_180.z = local_1b0.z;
  local_1b0._0_8_ = VVar2._0_8_;
  local_180.x = local_1b0.x;
  local_180.y = local_1b0.y;
  local_1b0 = VVar2;
  VVar2 = operator*(local_b0,(Vec3 *)this_01);
  local_1d0.z = VVar2.z;
  local_1c0.z = local_1d0.z;
  local_1d0._0_8_ = VVar2._0_8_;
  local_1c0.x = local_1d0.x;
  local_1c0.y = local_1d0.y;
  VVar2 = operator+(&local_180,&local_1c0);
  local_1e0.z = VVar2.z;
  local_170.z = local_1e0.z;
  local_1e0._0_8_ = VVar2._0_8_;
  local_170.x = local_1e0.x;
  local_170.y = local_1e0.y;
  VVar2 = operator-(&local_170,(Vec3 *)&half_height);
  local_1e8 = VVar2.z;
  local_158 = local_1e8;
  local_1f0 = VVar2._0_8_;
  local_160 = local_1f0;
  (this->upper_left_corner).z = local_1e8;
  (this->upper_left_corner).x = (float)(undefined4)local_1f0;
  (this->upper_left_corner).y = (float)local_1f0._4_4_;
  VVar2 = operator*(local_b4 + local_b4,(Vec3 *)this_00);
  local_208 = VVar2.z;
  local_210 = VVar2._0_8_;
  (this->horizontal).z = local_208;
  (this->horizontal).x = (float)(undefined4)local_210;
  (this->horizontal).y = (float)local_210._4_4_;
  VVar2 = operator*(local_b0 + local_b0,(Vec3 *)this_01);
  local_230 = VVar2._0_8_;
  local_228 = VVar2.z;
  (this->vertical).x = (float)(undefined4)local_230;
  (this->vertical).y = (float)local_230._4_4_;
  (this->vertical).z = local_228;
  return;
}

Assistant:

constexpr Camera (Vec3 lookfrom, Vec3 lookat, Vec3 vup, float vfov, float aspect)
	{
		Vec3 u, v, w;
		float theta = vfov * 3.141 / 180;
		float half_height = tan (theta / 2);
		float half_width = aspect * half_height;
		origin = lookfrom;
		w = normalize (lookfrom - lookat);
		u = normalize (cross (vup, w));
		v = cross (w, u);
		upper_left_corner = origin - half_width * u + half_height * v - w;
		horizontal = 2 * half_width * u;
		vertical = 2 * half_height * v;
	}